

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.cxx
# Opt level: O0

string * cmEscapeQuotes_abi_cxx11_(string *__return_storage_ptr__,string_view str)

{
  char cVar1;
  const_iterator pvVar2;
  char ch;
  const_iterator __end1;
  const_iterator __begin1;
  string_view *__range1;
  undefined1 local_20 [8];
  string_view str_local;
  string *result;
  
  str_local._M_len = (size_t)str._M_str;
  local_20 = (undefined1  [8])str._M_len;
  str_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::basic_string_view<char,_std::char_traits<char>_>::size
            ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  __end1 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  for (; __end1 != pvVar2; __end1 = __end1 + 1) {
    cVar1 = *__end1;
    if (cVar1 == '\"') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\\');
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmEscapeQuotes(cm::string_view str)
{
  std::string result;
  result.reserve(str.size());
  for (const char ch : str) {
    if (ch == '"') {
      result += '\\';
    }
    result += ch;
  }
  return result;
}